

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O2

SW_FT_Error ft_stroker_inside(SW_FT_Stroker stroker,SW_FT_Int side,SW_FT_Fixed line_length)

{
  ulong uVar1;
  SW_FT_Error SVar2;
  SW_FT_Angle SVar3;
  SW_FT_Long SVar4;
  long lVar5;
  long lVar6;
  SW_FT_Vector local_58;
  SW_FT_Vector sigma;
  
  uVar1 = (ulong)(uint)side;
  lVar6 = uVar1 * -0xb40000 + 0x5a0000;
  SVar3 = SW_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  if (((0xfffffffffe98fffc < SVar3 - 0xb38002U) && (line_length != 0)) &&
     (stroker->borders[uVar1].movable != '\0')) {
    SW_FT_Vector_Unit(&sigma,SVar3 / 2);
    SVar4 = SW_FT_MulDiv(stroker->radius,sigma.y,sigma.x);
    if (SVar4 != 0) {
      lVar5 = -SVar4;
      if (0 < SVar4) {
        lVar5 = SVar4;
      }
      if ((lVar5 <= line_length) && (lVar5 <= stroker->line_length)) {
        lVar5 = stroker->angle_in;
        SVar4 = SW_FT_DivFix(stroker->radius,sigma.x);
        SW_FT_Vector_From_Polar(&local_58,SVar4,SVar3 / 2 + lVar6 + lVar5);
        local_58.x = (stroker->center).x + local_58.x;
        local_58.y = (stroker->center).y + local_58.y;
        goto LAB_0010a03a;
      }
    }
  }
  SW_FT_Vector_From_Polar(&local_58,stroker->radius,lVar6 + stroker->angle_out);
  local_58.x = (stroker->center).x + local_58.x;
  local_58.y = (stroker->center).y + local_58.y;
  stroker->borders[uVar1].movable = '\0';
LAB_0010a03a:
  SVar2 = ft_stroke_border_lineto(stroker->borders + uVar1,&local_58,'\0');
  return SVar2;
}

Assistant:

static SW_FT_Error ft_stroker_inside(SW_FT_Stroker stroker, SW_FT_Int side,
                                     SW_FT_Fixed line_length)
{
    SW_FT_StrokeBorder border = stroker->borders + side;
    SW_FT_Angle        phi, theta, rotate;
    SW_FT_Fixed        length;
    SW_FT_Vector       sigma, delta;
    SW_FT_Error        error = 0;
    SW_FT_Bool         intersect; /* use intersection of lines? */

    rotate = SW_FT_SIDE_TO_ROTATE(side);

    theta = SW_FT_Angle_Diff(stroker->angle_in, stroker->angle_out) / 2;

    /* Only intersect borders if between two lineto's and both */
    /* lines are long enough (line_length is zero for curves). */
    if (!border->movable || line_length == 0  ||
         theta > 0x59C000 || theta < -0x59C000 )
        intersect = FALSE;
    else {
      /* compute minimum required length of lines */
      SW_FT_Fixed  min_length;


      SW_FT_Vector_Unit( &sigma, theta );
      min_length =
        ft_pos_abs( SW_FT_MulDiv( stroker->radius, sigma.y, sigma.x ) );

      intersect = SW_FT_BOOL( min_length                         &&
                           stroker->line_length >= min_length &&
                           line_length          >= min_length );
    }

    if (!intersect) {
        SW_FT_Vector_From_Polar(&delta, stroker->radius,
                                stroker->angle_out + rotate);
        delta.x += stroker->center.x;
        delta.y += stroker->center.y;

        border->movable = FALSE;
    } else {
        /* compute median angle */
        phi = stroker->angle_in + theta + rotate;

      length = SW_FT_DivFix( stroker->radius, sigma.x );

      SW_FT_Vector_From_Polar( &delta, length, phi );
      delta.x += stroker->center.x;
      delta.y += stroker->center.y;
    }

    error = ft_stroke_border_lineto(border, &delta, FALSE);

    return error;
}